

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerSocket.cpp
# Opt level: O0

int __thiscall ServerSocketUDP::bindServer(ServerSocketUDP *this)

{
  int iVar1;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  char local_38 [8];
  char ip [16];
  undefined1 local_20 [8];
  sockaddr_in serverAddress;
  ServerSocketUDP *this_local;
  
  serverAddress.sin_zero = (uchar  [8])this;
  getLocalIP(local_38);
  local_20._0_2_ = 2;
  local_20._4_4_ = inet_addr(local_38);
  local_20._2_2_ = htons((uint16_t)this->portNumber);
  iVar1 = bind(this->serverSocketFD,(sockaddr *)local_20,0x10);
  if (iVar1 < 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error in binding: ");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"Error Code: ");
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    poVar2 = std::operator<<(poVar2,pcVar4);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  return 1;
}

Assistant:

int ServerSocketUDP::bindServer() {

    struct sockaddr_in serverAddress;
    char ip[16];
    getLocalIP(ip);
    serverAddress.sin_family = AF_INET; //指定协议地址族
    serverAddress.sin_addr.s_addr = inet_addr(ip);
    serverAddress.sin_port = htons(this->portNumber);

    //绑定对应端口，监听服务
    if (bind(this->serverSocketFD, (struct sockaddr *) &serverAddress, sizeof(serverAddress)) < 0) {
        cerr << "Error in binding: " << endl;
        cout << "Error Code: " << strerror(errno) << endl;
        exit(1);
    }
    return 1;
}